

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_contour.cpp
# Opt level: O0

void __thiscall agg::vcgen_contour::rewind(vcgen_contour *this,FILE *__stream)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double local_28;
  uint param_1_local;
  vcgen_contour *this_local;
  
  if (this->m_status == initial) {
    vertex_sequence<agg::vertex_dist,_6U>::close(&this->m_src_vertices,1);
    if (((this->m_auto_detect & 1U) != 0) && (bVar1 = is_oriented(this->m_orientation), !bVar1)) {
      dVar3 = calc_polygon_area<agg::vertex_sequence<agg::vertex_dist,6u>>(&this->m_src_vertices);
      uVar2 = 0x20;
      if (0.0 < dVar3) {
        uVar2 = 0x10;
      }
      this->m_orientation = uVar2;
    }
    bVar1 = is_oriented(this->m_orientation);
    if (bVar1) {
      bVar1 = is_ccw(this->m_orientation);
      if (bVar1) {
        local_28 = this->m_width;
      }
      else {
        local_28 = -this->m_width;
      }
      math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::width(&this->m_stroker,local_28);
    }
  }
  this->m_status = ready;
  this->m_src_vertex = 0;
  return;
}

Assistant:

void vcgen_contour::rewind(unsigned)
    {
        if(m_status == initial)
        {
            m_src_vertices.close(true);
            if(m_auto_detect)
            {
                if(!is_oriented(m_orientation))
                {
                    m_orientation = (calc_polygon_area(m_src_vertices) > 0.0) ? 
                                    path_flags_ccw : 
                                    path_flags_cw;
                }
            }
            if(is_oriented(m_orientation))
            {
                m_stroker.width(is_ccw(m_orientation) ? m_width : -m_width);
            }
        }
        m_status = ready;
        m_src_vertex = 0;
    }